

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> *field)

{
  GlobalModuleField *pGVar1;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_50;
  Global *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pGVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
           .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl;
  if ((pGVar1->global).name._M_string_length != 0) {
    local_48 = (Global *)
               (pGVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
               filename.data_;
    uStack_40 = (undefined4)
                (pGVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
                filename.size_;
    uStack_3c = *(undefined4 *)
                 ((long)&(pGVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
                         super_ModuleField.loc.filename.size_ + 4);
    local_38 = (pGVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
               field_1.field_0.line;
    iStack_34 = (pGVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
                field_1.field_0.first_column;
    iStack_30 = (pGVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
                field_1.field_0.last_column;
    uStack_2c = *(undefined4 *)
                 ((long)&(pGVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
                         super_ModuleField.loc.field_1 + 0xc);
    local_28 = (undefined4)
               ((ulong)((long)(this->globals).
                              super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->globals).
                             super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->global_bindings,&pGVar1->global);
  }
  local_48 = &pGVar1->global;
  std::vector<wabt::Global*,std::allocator<wabt::Global*>>::emplace_back<wabt::Global*>
            ((vector<wabt::Global*,std::allocator<wabt::Global*>> *)&this->globals,&local_48);
  local_50._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
       .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl = (GlobalModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_50);
  if (local_50._M_head_impl != (GlobalModuleField *)0x0) {
    (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<GlobalModuleField> field) {
  Global& global = field->global;
  if (!global.name.empty()) {
    global_bindings.emplace(global.name, Binding(field->loc, globals.size()));
  }
  globals.push_back(&global);
  fields.push_back(std::move(field));
}